

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::changeImplRowDualUpper
          (HPresolve *this,HighsInt row,double newUpper,HighsInt originCol)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  reference pvVar6;
  reference pvVar7;
  double *pdVar8;
  reference this_00;
  char *pcVar9;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int in_ESI;
  iterator *rhs;
  long in_RDI;
  HighsLinearSumBounds *in_XMM0_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  HighsSliceNonzero *nonzero;
  iterator __end1;
  iterator __begin1;
  HighsTripletTreeSlicePreOrder *__range1;
  bool newDualImplied;
  HighsInt oldUpperSource;
  double oldImplUpper;
  undefined4 in_stack_fffffffffffffe68;
  HighsInt in_stack_fffffffffffffe6c;
  HPresolve *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  HighsInt in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar11;
  int *in_stack_fffffffffffffe88;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe90;
  HighsInt in_stack_fffffffffffffe9c;
  HPresolve *in_stack_fffffffffffffea0;
  undefined1 *puVar12;
  double in_stack_fffffffffffffeb8;
  HighsLinearSumBounds *coefficient;
  value_type in_stack_fffffffffffffec8;
  value_type in_stack_fffffffffffffecc;
  HighsLinearSumBounds *in_stack_fffffffffffffed0;
  bool local_119;
  iterator local_f0;
  iterator local_b0;
  undefined1 local_70 [40];
  undefined1 *local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  bool local_2d;
  value_type local_2c;
  double local_28;
  int local_1c;
  HighsLinearSumBounds *local_18;
  int local_c;
  
  local_1c = in_EDX;
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x238),(long)in_ESI);
  local_28 = *pvVar6;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x268),(long)local_c);
  local_2c = *pvVar7;
  if ((-*(double *)(*(long *)(in_RDI + 8) + 0x120) <= local_28) &&
     ((double)local_18 < -*(double *)(*(long *)(in_RDI + 8) + 0x120))) {
    markChangedRow(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  bVar2 = isDualImpliedFree((HPresolve *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c);
  dVar1 = local_28;
  local_119 = false;
  if (!bVar2) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x208),(long)local_c);
    local_119 = false;
    if (*pvVar6 + *(double *)(*(long *)(in_RDI + 8) + 0x120) < dVar1) {
      in_stack_fffffffffffffed0 = local_18;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x208),(long)local_c)
      ;
      local_119 = (double)in_stack_fffffffffffffed0 <=
                  *pvVar6 + *(double *)(*(long *)(in_RDI + 8) + 0x120);
    }
  }
  local_2d = local_119;
  if (local_2c != local_1c) {
    if ((local_2c != -1) &&
       (in_stack_fffffffffffffecc = local_2c,
       pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x250),(long)local_c),
       in_stack_fffffffffffffecc != *pvVar7)) {
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x298),(long)local_2c);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
                 (key_type_conflict1 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                );
    }
    if (local_1c != -1) {
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x298),(long)local_1c);
      pVar10 = std::set<int,std::less<int>,std::allocator<int>>::emplace<int&>
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_40 = (_Base_ptr)pVar10.first._M_node;
      local_38 = pVar10.second;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x268),(long)local_c);
    *pvVar7 = local_1c;
    in_stack_fffffffffffffec8 = local_1c;
  }
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x238),(long)local_c);
  *pvVar6 = (value_type)local_18;
  coefficient = local_18;
  if ((local_2d & 1U) == 0) {
    pdVar8 = std::min<double>(&local_28,(double *)&local_18);
    in_stack_fffffffffffffeb8 = *pdVar8;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x208),(long)local_c);
    coefficient = local_18;
    if (*pvVar6 <= in_stack_fffffffffffffeb8) {
      return;
    }
  }
  puVar12 = local_70;
  getRowVector(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  local_48 = puVar12;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin
            ((HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::end
            ((HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  while( true ) {
    rhs = &local_f0;
    bVar2 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator!=(&local_b0,rhs);
    if (!bVar2) break;
    this_00 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator*(&local_b0);
    pcVar9 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    uVar3 = (uint)pcVar9;
    iVar11 = local_c;
    HighsSliceNonzero::value(this_00);
    pcVar9 = (char *)(ulong)uVar3;
    HighsLinearSumBounds::updatedImplVarUpper
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
               (double)coefficient,in_stack_fffffffffffffeb8,(HighsInt)((ulong)puVar12 >> 0x20));
    pcVar9 = HighsSliceNonzero::index(this_00,pcVar9,__c_00);
    uVar4 = SUB84(pcVar9,0);
    pcVar9 = (char *)((ulong)pcVar9 & 0xffffffff);
    markChangedCol(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    if ((local_2d & 1U) != 0) {
      pcVar9 = HighsSliceNonzero::index(this_00,pcVar9,__c_01);
      uVar5 = SUB84(pcVar9,0);
      pcVar9 = (char *)((ulong)pcVar9 & 0xffffffff);
      bVar2 = isImpliedFree(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      if (bVar2) {
        in_stack_fffffffffffffe70 = (HPresolve *)(in_RDI + 0x4f0);
        pcVar9 = HighsSliceNonzero::index(this_00,pcVar9,__c_02);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   CONCAT44(iVar11,uVar4),(int *)CONCAT44(uVar5,(int)pcVar9),
                   (int *)in_stack_fffffffffffffe70);
      }
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++
              ((iterator *)in_stack_fffffffffffffe70);
  }
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x6f139f);
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x6f13ac);
  return;
}

Assistant:

void HPresolve::changeImplRowDualUpper(HighsInt row, double newUpper,
                                       HighsInt originCol) {
  double oldImplUpper = implRowDualUpper[row];
  HighsInt oldUpperSource = rowDualUpperSource[row];

  if (oldImplUpper >= -options->dual_feasibility_tolerance &&
      newUpper < -options->dual_feasibility_tolerance)
    markChangedRow(row);

  bool newDualImplied =
      !isDualImpliedFree(row) &&
      oldImplUpper > rowDualUpper[row] + options->dual_feasibility_tolerance &&
      newUpper <= rowDualUpper[row] + options->dual_feasibility_tolerance;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originCol) {
    if (oldUpperSource != -1 && oldUpperSource != rowDualLowerSource[row])
      implRowDualSourceByCol[oldUpperSource].erase(row);
    if (originCol != -1) implRowDualSourceByCol[originCol].emplace(row);

    rowDualUpperSource[row] = originCol;
  }

  // update implied bound
  implRowDualUpper[row] = newUpper;

  // nothing needs to be updated
  if (!newDualImplied && std::min(oldImplUpper, newUpper) >= rowDualUpper[row])
    return;

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedImplVarUpper(
        nonzero.index(), row, nonzero.value(), oldImplUpper, oldUpperSource);
    markChangedCol(nonzero.index());

    if (newDualImplied && isImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(row, nonzero.index());
  }
}